

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall World::Kick(World *this,Command_Source *from,Character *victim,bool announce)

{
  allocator local_109;
  string local_108;
  string local_e8;
  byte local_c2;
  allocator local_c1;
  _Hash_node<std::pair<const_IPAddress,_double>,_true> local_c0;
  _Hash_node<std::pair<const_IPAddress,_double>,_true> local_a0;
  allocator local_69;
  string local_68;
  string local_48;
  undefined1 local_21;
  Character *pCStack_20;
  bool announce_local;
  Character *victim_local;
  Command_Source *from_local;
  World *this_local;
  
  local_21 = announce;
  pCStack_20 = victim;
  victim_local = (Character *)from;
  from_local = (Command_Source *)this;
  if (announce) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"announce_removed",&local_69);
    (*(pCStack_20->super_Command_Source)._vptr_Command_Source[2])(&local_a0);
    local_c2 = 0;
    if (victim_local == (Character *)0x0) {
      std::allocator<char>::allocator();
      local_c2 = 1;
      std::__cxx11::string::string((string *)&local_c0,"server",&local_c1);
    }
    else {
      (*(victim_local->super_Command_Source)._vptr_Command_Source[2])(&local_c0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"kicked",&local_109);
    I18N::Format<>(&local_e8,&this->i18n,&local_108);
    I18N::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (&local_48,&this->i18n,&local_68,&local_a0,&local_c0,&local_e8);
    ServerMsg(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::__cxx11::string::~string((string *)&local_c0);
    if ((local_c2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  Client::Close(&pCStack_20->player->client->super_Client,false);
  return;
}

Assistant:

void World::Kick(Command_Source *from, Character *victim, bool announce)
{
	if (announce)
		this->ServerMsg(i18n.Format("announce_removed", victim->SourceName(), from ? from->SourceName() : "server", i18n.Format("kicked")));

	victim->player->client->Close();
}